

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk.cpp
# Opt level: O1

Result ValidateTonkSocketConfig(TonkSocketConfig *config)

{
  undefined8 *puVar1;
  Result *success;
  long in_RSI;
  undefined1 *local_38;
  long local_30;
  undefined1 local_28 [16];
  
  if (*(uint *)(in_RSI + 0x34) < 30000) {
    local_38 = local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"UDPConnectIntervalUsec < 30 ms invalid","");
    puVar1 = (undefined8 *)operator_new(0x38);
    *puVar1 = "ValidateTonkSocketConfig";
    puVar1[1] = puVar1 + 3;
    std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 1),local_38,local_38 + local_30);
  }
  else if (*(uint *)(in_RSI + 0x34) < 0xf4241) {
    if (*(uint *)(in_RSI + 0x38) < 1000000) {
      local_38 = local_28;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"ConnectionTimeoutUsec < 1 second invalid","");
      puVar1 = (undefined8 *)operator_new(0x38);
      *puVar1 = "ValidateTonkSocketConfig";
      puVar1[1] = puVar1 + 3;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 1),local_38,local_38 + local_30)
      ;
    }
    else if (*(uint *)(in_RSI + 0x38) < 0xaba9501) {
      if ((*(uint *)(in_RSI + 0x1c) == 0) || (*(long *)(in_RSI + 0x50) != 0)) {
        if (*(uint *)(in_RSI + 0x1c) < 0x10000) {
          if (*(uint *)(in_RSI + 0x2c) < 5000) {
            local_38 = local_28;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_38,"TimerIntervalMsec < TONK_TIMER_INTERVAL_MIN invalid","")
            ;
            puVar1 = (undefined8 *)operator_new(0x38);
            *puVar1 = "ValidateTonkSocketConfig";
            puVar1[1] = puVar1 + 3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar1 + 1),local_38,local_38 + local_30);
          }
          else if (*(uint *)(in_RSI + 0x2c) < 0x186a1) {
            if (*(uint *)(in_RSI + 0x30) < 2000000) {
              local_38 = local_28;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_38,
                         "NoDataTimeoutUsec < TONK_NO_DATA_TIMEOUT_USEC_MIN invalid","");
              puVar1 = (undefined8 *)operator_new(0x38);
              *puVar1 = "ValidateTonkSocketConfig";
              puVar1[1] = puVar1 + 3;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)(puVar1 + 1),local_38,local_38 + local_30);
            }
            else {
              if (*(uint *)(in_RSI + 0x30) < 0x23c34601) {
                *(undefined8 *)config = 0;
                return (Result)(ErrorResult *)config;
              }
              local_38 = local_28;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_38,
                         "NoDataTimeoutUsec > TONK_NO_DATA_TIMEOUT_USEC_MAX invalid","");
              puVar1 = (undefined8 *)operator_new(0x38);
              *puVar1 = "ValidateTonkSocketConfig";
              puVar1[1] = puVar1 + 3;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)(puVar1 + 1),local_38,local_38 + local_30);
            }
          }
          else {
            local_38 = local_28;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_38,"TimerIntervalMsec > TONK_TIMER_INTERVAL_MAX invalid","")
            ;
            puVar1 = (undefined8 *)operator_new(0x38);
            *puVar1 = "ValidateTonkSocketConfig";
            puVar1[1] = puVar1 + 3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar1 + 1),local_38,local_38 + local_30);
          }
        }
        else {
          local_38 = local_28;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"UDPPort invalid","");
          puVar1 = (undefined8 *)operator_new(0x38);
          *puVar1 = "ValidateTonkSocketConfig";
          puVar1[1] = puVar1 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar1 + 1),local_38,local_38 + local_30);
        }
      }
      else {
        local_38 = local_28;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_38,"OnIncomingConnection null","");
        puVar1 = (undefined8 *)operator_new(0x38);
        *puVar1 = "ValidateTonkSocketConfig";
        puVar1[1] = puVar1 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar1 + 1),local_38,local_38 + local_30);
      }
    }
    else {
      local_38 = local_28;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_38,"ConnectionTimeoutUsec > 3 minutes invalid","");
      puVar1 = (undefined8 *)operator_new(0x38);
      *puVar1 = "ValidateTonkSocketConfig";
      puVar1[1] = puVar1 + 3;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 1),local_38,local_38 + local_30)
      ;
    }
  }
  else {
    local_38 = local_28;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"UDPConnectIntervalUsec > 1 second invalid","");
    puVar1 = (undefined8 *)operator_new(0x38);
    *puVar1 = "ValidateTonkSocketConfig";
    puVar1[1] = puVar1 + 3;
    std::__cxx11::string::_M_construct<char*>((string *)(puVar1 + 1),local_38,local_38 + local_30);
  }
  *(undefined4 *)(puVar1 + 5) = 0;
  puVar1[6] = 1;
  *(undefined8 **)config = puVar1;
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return (Result)(ErrorResult *)config;
}

Assistant:

static Result ValidateTonkSocketConfig(const TonkSocketConfig* config)
{
    if (config->UDPConnectIntervalUsec < 30 * 1000) {
        return Result("ValidateTonkSocketConfig", "UDPConnectIntervalUsec < 30 ms invalid", ErrorType::Tonk, Tonk_InvalidInput);
    }
    if (config->UDPConnectIntervalUsec > 1000 * 1000) {
        return Result("ValidateTonkSocketConfig", "UDPConnectIntervalUsec > 1 second invalid", ErrorType::Tonk, Tonk_InvalidInput);
    }

    if (config->ConnectionTimeoutUsec < 1000 * 1000) {
        return Result("ValidateTonkSocketConfig", "ConnectionTimeoutUsec < 1 second invalid", ErrorType::Tonk, Tonk_InvalidInput);
    }
    if (config->ConnectionTimeoutUsec > 3 * 60 * 1000 * 1000) {
        return Result("ValidateTonkSocketConfig", "ConnectionTimeoutUsec > 3 minutes invalid", ErrorType::Tonk, Tonk_InvalidInput);
    }

    // OnIncomingConnection is null if no new connections are allowed.
    // OnOutgoingConnection is null if no outgoing connections will be made
    // OnP2PConnectionStart is null if no P2P connections are allowed
    // or if no connection callback is needed.

    // If UDP port is set but incoming connection is not set:
    if (config->UDPListenPort != 0 && !config->OnIncomingConnection) {
        return Result("ValidateTonkSocketConfig", "OnIncomingConnection null", ErrorType::Tonk, Tonk_InvalidInput);
    }

    if (config->UDPListenPort > 65535) {
        return Result("ValidateTonkSocketConfig", "UDPPort invalid", ErrorType::Tonk, Tonk_InvalidInput);
    }

    if (config->TimerIntervalUsec < TONK_TIMER_INTERVAL_MIN) {
        return Result("ValidateTonkSocketConfig", "TimerIntervalMsec < TONK_TIMER_INTERVAL_MIN invalid", ErrorType::Tonk, Tonk_InvalidInput);
    }
    if (config->TimerIntervalUsec > TONK_TIMER_INTERVAL_MAX) {
        return Result("ValidateTonkSocketConfig", "TimerIntervalMsec > TONK_TIMER_INTERVAL_MAX invalid", ErrorType::Tonk, Tonk_InvalidInput);
    }

    if (config->NoDataTimeoutUsec < TONK_NO_DATA_TIMEOUT_USEC_MIN) {
        return Result("ValidateTonkSocketConfig", "NoDataTimeoutUsec < TONK_NO_DATA_TIMEOUT_USEC_MIN invalid", ErrorType::Tonk, Tonk_InvalidInput);
    }
    if (config->NoDataTimeoutUsec > TONK_NO_DATA_TIMEOUT_USEC_MAX) {
        return Result("ValidateTonkSocketConfig", "NoDataTimeoutUsec > TONK_NO_DATA_TIMEOUT_USEC_MAX invalid", ErrorType::Tonk, Tonk_InvalidInput);
    }

    return Result::Success();
}